

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::RasterizationTests::init(RasterizationTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  GLenum GVar2;
  GLenum GVar3;
  Context *pCVar4;
  _func_int **pp_Var5;
  uint uVar6;
  int extraout_EAX;
  TestNode *pTVar7;
  TestNode *pTVar8;
  long *plVar9;
  long lVar10;
  LineInterpolationTest *pLVar11;
  long *plVar12;
  long lVar13;
  string name;
  allocator<char> local_c5;
  uint local_c4;
  TestNode *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long local_78;
  long local_70;
  TestNode *local_68;
  CullMode *local_60;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"primitives",
             "Primitive rasterization");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  pTVar8 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar4->m_testCtx,"triangles",
             "Render primitives as GL_TRIANGLES, verify rasterization result");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0x300000000;
  *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 4;
  *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__BaseRenderingCase_007762f8;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar4->m_testCtx,"triangle_strip",
             "Render primitives as GL_TRIANGLE_STRIP, verify rasterization result");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0x300000000;
  *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 5;
  *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__BaseRenderingCase_007763b8;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar4->m_testCtx,"triangle_fan",
             "Render primitives as GL_TRIANGLE_FAN, verify rasterization result");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0x300000000;
  *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 6;
  *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__BaseRenderingCase_00776410;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xb0);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar4->m_testCtx,"lines",
             "Render primitives as GL_LINES, verify rasterization result");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0x300000000;
  pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x1;
  *(undefined2 *)&pTVar8[1].m_description._M_string_length = 1;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__BaseRenderingCase_00776468;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xb0);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar4->m_testCtx,"line_strip",
             "Render primitives as GL_LINE_STRIP, verify rasterization result");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0x300000000;
  pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x3;
  *(undefined2 *)&pTVar8[1].m_description._M_string_length = 1;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__BaseRenderingCase_007764d8;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xb0);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar4->m_testCtx,"line_loop",
             "Render primitives as GL_LINE_LOOP, verify rasterization result");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0x300000000;
  pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x2;
  *(undefined2 *)&pTVar8[1].m_description._M_string_length = 1;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__BaseRenderingCase_00776530;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xb0);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar4->m_testCtx,"lines_wide",
             "Render primitives as GL_LINES with wide lines, verify rasterization result");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0x300000000;
  pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x100000001;
  *(undefined2 *)&pTVar8[1].m_description._M_string_length = 1;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x40a000003f800000;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__BaseRenderingCase_00776468;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xb0);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar4->m_testCtx,"line_strip_wide",
             "Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0x300000000;
  pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x100000003;
  *(undefined2 *)&pTVar8[1].m_description._M_string_length = 1;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x40a000003f800000;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__BaseRenderingCase_007764d8;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xb0);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar4->m_testCtx,"line_loop_wide",
             "Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0x300000000;
  pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x100000002;
  *(undefined2 *)&pTVar8[1].m_description._M_string_length = 1;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x40a000003f800000;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__BaseRenderingCase_00776530;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar4->m_testCtx,"points",
             "Render primitives as GL_POINTS, verify rasterization result");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__BaseRenderingCase_00776588;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0x300000000;
  *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 1;
  *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f80000041200000;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fill_rules",
             "Primitive fill rules");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  pTVar8 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__FillRuleCase_007765d8;
  tcu::TestCase::TestCase((TestCase *)pTVar8,pCVar4->m_testCtx,"basic_quad","Verify fill rules");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 0;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__FillRuleCase_007765d8;
  *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 2;
  *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__FillRuleCase_007765d8;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,pCVar4->m_testCtx,"basic_quad_reverse","Verify fill rules");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__FillRuleCase_007765d8;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 1;
  *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 2;
  *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__FillRuleCase_007765d8;
  tcu::TestCase::TestCase((TestCase *)pTVar8,pCVar4->m_testCtx,"clipped_full","Verify fill rules");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000040;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__FillRuleCase_007765d8;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 2;
  *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 0xf;
  *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__FillRuleCase_007765d8;
  tcu::TestCase::TestCase((TestCase *)pTVar8,pCVar4->m_testCtx,"clipped_partly","Verify fill rules")
  ;
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000040;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__FillRuleCase_007765d8;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 3;
  *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 0xf;
  *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xa8);
  pCVar4 = (this->super_TestCaseGroup).m_context;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__FillRuleCase_007765d8;
  tcu::TestCase::TestCase((TestCase *)pTVar8,pCVar4->m_testCtx,"projected","Verify fill rules");
  pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__FillRuleCase_007765d8;
  *(undefined8 *)((long)&pTVar8[1].m_name.field_2 + 8) = 4;
  *(undefined4 *)&pTVar8[1].m_description._M_dataplus._M_p = 2;
  *(undefined1 *)((long)&pTVar8[1].m_description._M_dataplus._M_p + 4) = 1;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"culling",
             "Culling");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  lVar13 = 0;
  local_68 = (TestNode *)this;
  do {
    local_60 = init::cullModes + lVar13;
    local_58 = init::cullModes[lVar13].prefix;
    lVar10 = 0;
    local_78 = lVar13;
    do {
      local_c0 = (TestNode *)(init::primitiveTypes + lVar10);
      local_c4 = 0x776201;
      lVar13 = 0;
      local_70 = lVar10;
      do {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_50,local_58,&local_c5);
        plVar9 = (long *)std::__cxx11::string::append((char *)local_50);
        plVar12 = plVar9 + 2;
        if ((long *)*plVar9 == plVar12) {
          local_88 = *plVar12;
          lStack_80 = plVar9[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar12;
          local_98 = (long *)*plVar9;
        }
        local_90 = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_98);
        plVar12 = plVar9 + 2;
        if ((long *)*plVar9 == plVar12) {
          local_a8 = *plVar12;
          lStack_a0 = plVar9[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar12;
          local_b8 = (long *)*plVar9;
        }
        local_b0 = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        pTVar8 = (TestNode *)operator_new(0xa8);
        pCVar4 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        GVar1 = local_60->mode;
        GVar2 = *(GLenum *)&local_c0->_vptr_TestNode;
        GVar3 = init::frontOrders[lVar13].mode;
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,pCVar4->m_testCtx,(char *)local_b8,"Test primitive culling.");
        pTVar8[1]._vptr_TestNode = (_func_int **)pCVar4;
        pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
        *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
        *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
        pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__BaseRenderingCase_00776628;
        *(GLenum *)((long)&pTVar8[1].m_name.field_2 + 8) = GVar1;
        *(GLenum *)((long)&pTVar8[1].m_name.field_2 + 0xc) = GVar2;
        *(GLenum *)&pTVar8[1].m_description._M_dataplus._M_p = GVar3;
        tcu::TestNode::addChild(pTVar7,pTVar8);
        this = (RasterizationTests *)local_68;
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        lVar13 = 1;
        uVar6 = local_c4 & 1;
        local_c4 = 0;
      } while (uVar6 != 0);
      lVar10 = local_70 + 1;
    } while (lVar10 != 3);
    lVar13 = local_78 + 1;
  } while (lVar13 != 3);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,((TestNode *)this)->m_testCtx,"interpolation",
             "Test interpolation");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,((TestNode *)this)->m_testCtx,"basic",
             "Non-projective interpolation");
  local_c0 = pTVar7;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar7 = (TestNode *)operator_new(0xb0);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,(TestContext *)*pp_Var5,"triangles","Verify triangle interpolation")
  ;
  pTVar7[1]._vptr_TestNode = pp_Var5;
  pTVar7[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar7[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TriangleInterpolationTest_00776678;
  *(undefined4 *)((long)&pTVar7[1].m_name.field_2 + 8) = 4;
  pTVar7[1].m_name.field_2._M_local_buf[0xc] = '\0';
  pTVar7[1].m_description._M_dataplus._M_p = (pointer)0x3;
  *(undefined1 *)&pTVar7[1].m_description._M_string_length = 1;
  tcu::TestNode::addChild(pTVar8,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xb0);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,(TestContext *)*pp_Var5,"triangle_strip",
             "Verify triangle strip interpolation");
  pTVar7[1]._vptr_TestNode = pp_Var5;
  pTVar7[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar7[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TriangleInterpolationTest_00776678;
  *(undefined4 *)((long)&pTVar7[1].m_name.field_2 + 8) = 5;
  pTVar7[1].m_name.field_2._M_local_buf[0xc] = '\0';
  pTVar7[1].m_description._M_dataplus._M_p = (pointer)0x3;
  *(undefined1 *)&pTVar7[1].m_description._M_string_length = 1;
  tcu::TestNode::addChild(pTVar8,pTVar7);
  pTVar7 = (TestNode *)operator_new(0xb0);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar7,(TestContext *)*pp_Var5,"triangle_fan",
             "Verify triangle fan interpolation");
  pTVar7[1]._vptr_TestNode = pp_Var5;
  pTVar7[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar7[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar7[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar7[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TriangleInterpolationTest_00776678;
  *(undefined4 *)((long)&pTVar7[1].m_name.field_2 + 8) = 6;
  pTVar7[1].m_name.field_2._M_local_buf[0xc] = '\0';
  pTVar7[1].m_description._M_dataplus._M_p = (pointer)0x3;
  *(undefined1 *)&pTVar7[1].m_description._M_string_length = 1;
  tcu::TestNode::addChild(pTVar8,pTVar7);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line interpolation",1,0,1.0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip interpolation",3,0,1.0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop interpolation",2,0,1.0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line interpolation",1,0,5.0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip interpolation",3,0,5.0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop interpolation",2,0,5.0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar11);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,((TestNode *)this)->m_testCtx,"projected",
             "Projective interpolation");
  tcu::TestNode::addChild(local_c0,pTVar7);
  pTVar8 = (TestNode *)operator_new(0xb0);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,(TestContext *)*pp_Var5,"triangles","Verify triangle interpolation")
  ;
  pTVar8[1]._vptr_TestNode = pp_Var5;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TriangleInterpolationTest_00776678;
  *(undefined4 *)((long)&pTVar8[1].m_name.field_2 + 8) = 4;
  pTVar8[1].m_name.field_2._M_local_buf[0xc] = '\x01';
  pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x3;
  *(undefined1 *)&pTVar8[1].m_description._M_string_length = 1;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xb0);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,(TestContext *)*pp_Var5,"triangle_strip",
             "Verify triangle strip interpolation");
  pTVar8[1]._vptr_TestNode = pp_Var5;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TriangleInterpolationTest_00776678;
  *(undefined4 *)((long)&pTVar8[1].m_name.field_2 + 8) = 5;
  pTVar8[1].m_name.field_2._M_local_buf[0xc] = '\x01';
  pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x3;
  *(undefined1 *)&pTVar8[1].m_description._M_string_length = 1;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pTVar8 = (TestNode *)operator_new(0xb0);
  pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar8,(TestContext *)*pp_Var5,"triangle_fan",
             "Verify triangle fan interpolation");
  pTVar8[1]._vptr_TestNode = pp_Var5;
  pTVar8[1].m_testCtx = (TestContext *)0xffffffff00000100;
  *(undefined4 *)&pTVar8[1].m_name._M_dataplus._M_p = 0xffffffff;
  *(undefined8 *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) = 0x3f8000003f800000;
  pTVar8[1].m_name.field_2._M_allocated_capacity = 0;
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TriangleInterpolationTest_00776678;
  *(undefined4 *)((long)&pTVar8[1].m_name.field_2 + 8) = 6;
  pTVar8[1].m_name.field_2._M_local_buf[0xc] = '\x01';
  pTVar8[1].m_description._M_dataplus._M_p = (pointer)0x3;
  *(undefined1 *)&pTVar8[1].m_description._M_string_length = 1;
  tcu::TestNode::addChild(pTVar7,pTVar8);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines",
             "Verify line interpolation",1,2,1.0);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip",
             "Verify line strip interpolation",3,2,1.0);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop",
             "Verify line loop interpolation",2,2,1.0);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"lines_wide",
             "Verify wide line interpolation",1,2,5.0);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_strip_wide",
             "Verify wide line strip interpolation",3,2,5.0);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pLVar11);
  pLVar11 = (LineInterpolationTest *)operator_new(0xf8);
  anon_unknown_1::LineInterpolationTest::LineInterpolationTest
            (pLVar11,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,"line_loop_wide",
             "Verify wide line loop interpolation",2,2,5.0);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pLVar11);
  return extraout_EAX;
}

Assistant:

void RasterizationTests::init (void)
{
	// .primitives
	{
		tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(m_testCtx, "primitives", "Primitive rasterization");

		addChild(primitives);

		primitives->addChild(new TrianglesCase		(m_context, "triangles",		"Render primitives as GL_TRIANGLES, verify rasterization result"));
		primitives->addChild(new TriangleStripCase	(m_context, "triangle_strip",	"Render primitives as GL_TRIANGLE_STRIP, verify rasterization result"));
		primitives->addChild(new TriangleFanCase	(m_context, "triangle_fan",		"Render primitives as GL_TRIANGLE_FAN, verify rasterization result"));
		primitives->addChild(new LinesCase			(m_context, "lines",			"Render primitives as GL_LINES, verify rasterization result",							PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineStripCase		(m_context, "line_strip",		"Render primitives as GL_LINE_STRIP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop",		"Render primitives as GL_LINE_LOOP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new LinesCase			(m_context, "lines_wide",		"Render primitives as GL_LINES with wide lines, verify rasterization result",			PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineStripCase		(m_context, "line_strip_wide",	"Render primitives as GL_LINE_STRIP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new LineLoopCase		(m_context, "line_loop_wide",	"Render primitives as GL_LINE_LOOP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new PointCase			(m_context, "points",			"Render primitives as GL_POINTS, verify rasterization result",							PRIMITIVEWIDENESS_WIDE));
	}

	// .fill_rules
	{
		tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(m_testCtx, "fill_rules", "Primitive fill rules");

		addChild(fillRules);

		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad",			"Verify fill rules",	FillRuleCase::FILLRULECASE_BASIC));
		fillRules->addChild(new FillRuleCase(m_context,	"basic_quad_reverse",	"Verify fill rules",	FillRuleCase::FILLRULECASE_REVERSED));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_full",			"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_FULL));
		fillRules->addChild(new FillRuleCase(m_context,	"clipped_partly",		"Verify fill rules",	FillRuleCase::FILLRULECASE_CLIPPED_PARTIAL));
		fillRules->addChild(new FillRuleCase(m_context,	"projected",			"Verify fill rules",	FillRuleCase::FILLRULECASE_PROJECTED));
	}

	// .culling
	{
		static const struct CullMode
		{
			glw::GLenum	mode;
			const char*	prefix;
		} cullModes[] =
		{
			{ GL_FRONT,				"front_"	},
			{ GL_BACK,				"back_"		},
			{ GL_FRONT_AND_BACK,	"both_"		},
		};
		static const struct PrimitiveType
		{
			glw::GLenum	type;
			const char*	name;
		} primitiveTypes[] =
		{
			{ GL_TRIANGLES,			"triangles"			},
			{ GL_TRIANGLE_STRIP,	"triangle_strip"	},
			{ GL_TRIANGLE_FAN,		"triangle_fan"		},
		};
		static const struct FrontFaceOrder
		{
			glw::GLenum	mode;
			const char*	postfix;
		} frontOrders[] =
		{
			{ GL_CCW,	""			},
			{ GL_CW,	"_reverse"	},
		};

		tcu::TestCaseGroup* const culling = new tcu::TestCaseGroup(m_testCtx, "culling", "Culling");

		addChild(culling);

		for (int cullModeNdx   = 0; cullModeNdx   < DE_LENGTH_OF_ARRAY(cullModes);      ++cullModeNdx)
		for (int primitiveNdx  = 0; primitiveNdx  < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveNdx)
		for (int frontOrderNdx = 0; frontOrderNdx < DE_LENGTH_OF_ARRAY(frontOrders);    ++frontOrderNdx)
		{
			const std::string name = std::string(cullModes[cullModeNdx].prefix) + primitiveTypes[primitiveNdx].name + frontOrders[frontOrderNdx].postfix;

			culling->addChild(new CullingTest(m_context, name.c_str(), "Test primitive culling.", cullModes[cullModeNdx].mode, primitiveTypes[primitiveNdx].type, frontOrders[frontOrderNdx].mode));
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(m_testCtx, "interpolation", "Test interpolation");

		addChild(interpolation);

		// .basic
		{
			tcu::TestCaseGroup* const basic = new tcu::TestCaseGroup(m_testCtx, "basic", "Non-projective interpolation");

			interpolation->addChild(basic);

			basic->addChild(new TriangleInterpolationTest		(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTest		(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new LineInterpolationTest			(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_NONE,	1.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	1.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	1.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_NONE,	5.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	5.0f));
			basic->addChild(new LineInterpolationTest			(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_NONE,	5.0f));
		}

		// .projected
		{
			tcu::TestCaseGroup* const projected = new tcu::TestCaseGroup(m_testCtx, "projected", "Projective interpolation");

			interpolation->addChild(projected);

			projected->addChild(new TriangleInterpolationTest	(m_context, "triangles",		"Verify triangle interpolation",		GL_TRIANGLES,		INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_strip",	"Verify triangle strip interpolation",	GL_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTest	(m_context, "triangle_fan",		"Verify triangle fan interpolation",	GL_TRIANGLE_FAN,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new LineInterpolationTest		(m_context, "lines",			"Verify line interpolation",			GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	1.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip",		"Verify line strip interpolation",		GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	1.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop",		"Verify line loop interpolation",		GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	1.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "lines_wide",		"Verify wide line interpolation",		GL_LINES,			INTERPOLATIONFLAGS_PROJECTED,	5.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_strip_wide",	"Verify wide line strip interpolation",	GL_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	5.0f));
			projected->addChild(new LineInterpolationTest		(m_context, "line_loop_wide",	"Verify wide line loop interpolation",	GL_LINE_LOOP,		INTERPOLATIONFLAGS_PROJECTED,	5.0f));
		}
	}
}